

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCompositeInertia.cpp
# Opt level: O3

ChMatrix33<double> * chrono::utils::CompositeInertia::InertiaShiftMatrix(ChVector<double> *v)

{
  double dVar1;
  double dVar2;
  undefined1 auVar3 [16];
  double dVar4;
  ChMatrix33<double> *shift;
  ChMatrix33<double> *in_RDI;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  dVar1 = v->m_data[2];
  dVar2 = v->m_data[1];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = dVar2;
  auVar3 = *(undefined1 (*) [16])v->m_data;
  auVar5._8_8_ = 0x8000000000000000;
  auVar5._0_8_ = 0x8000000000000000;
  auVar5 = vxorpd_avx512vl(auVar3,auVar5);
  dVar4 = dVar2 * auVar5._0_8_;
  auVar6._0_8_ = dVar1 * auVar5._0_8_;
  auVar6._8_8_ = dVar1 * auVar5._8_8_;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = dVar1 * dVar1;
  auVar5 = vfmadd213sd_fma(auVar8,auVar8,auVar7);
  auVar7 = vfmadd231sd_fma(auVar7,auVar3,auVar3);
  auVar9._8_8_ = 0;
  auVar9._0_8_ = dVar2 * dVar2;
  auVar3 = vfmadd231sd_fma(auVar9,auVar3,auVar3);
  (in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[0] =
       auVar5._0_8_;
  (in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4] =
       auVar7._0_8_;
  (in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8] =
       auVar3._0_8_;
  (in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1] = dVar4;
  (in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[3] = dVar4;
  dVar1 = (double)vmovlpd_avx(auVar6);
  (in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[2] = dVar1;
  dVar1 = (double)vmovhpd_avx(auVar6);
  (in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
  super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[5] = dVar1;
  *(undefined1 (*) [16])
   ((in_RDI->super_Matrix<double,_3,_3,_1,_3,_3>).
    super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array + 6) =
       auVar6;
  return in_RDI;
}

Assistant:

ChMatrix33<> CompositeInertia::InertiaShiftMatrix(const ChVector<>& v) {
    ChMatrix33<> shift;
    shift(0, 0) = v.y() * v.y() + v.z() * v.z();
    shift(1, 1) = v.x() * v.x() + v.z() * v.z();
    shift(2, 2) = v.x() * v.x() + v.y() * v.y();
    shift(0, 1) = -v.x() * v.y();
    shift(1, 0) = -v.x() * v.y();
    shift(0, 2) = -v.x() * v.z();
    shift(2, 0) = -v.x() * v.z();
    shift(1, 2) = -v.y() * v.z();
    shift(2, 1) = -v.y() * v.z();

    return shift;
}